

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::percolateDown(Heap<Gluco::Solver::VarOrderLt> *this,int i)

{
  int y;
  Var x_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_4c;
  int child;
  int x;
  int i_local;
  Heap<Gluco::Solver::VarOrderLt> *this_local;
  
  piVar4 = vec<int>::operator[](&this->heap,i);
  y = *piVar4;
  child = i;
  while( true ) {
    iVar2 = left(child);
    iVar3 = vec<int>::size(&this->heap);
    if (iVar3 <= iVar2) break;
    iVar2 = right(child);
    iVar3 = vec<int>::size(&this->heap);
    if (iVar2 < iVar3) {
      iVar2 = right(child);
      piVar4 = vec<int>::operator[](&this->heap,iVar2);
      x_00 = *piVar4;
      iVar2 = left(child);
      piVar4 = vec<int>::operator[](&this->heap,iVar2);
      bVar1 = Solver::VarOrderLt::operator()(&this->lt,x_00,*piVar4);
      if (!bVar1) goto LAB_007309b5;
      local_4c = right(child);
    }
    else {
LAB_007309b5:
      local_4c = left(child);
    }
    piVar4 = vec<int>::operator[](&this->heap,local_4c);
    bVar1 = Solver::VarOrderLt::operator()(&this->lt,*piVar4,y);
    if (!bVar1) break;
    piVar4 = vec<int>::operator[](&this->heap,local_4c);
    iVar2 = *piVar4;
    piVar4 = vec<int>::operator[](&this->heap,child);
    *piVar4 = iVar2;
    piVar4 = vec<int>::operator[](&this->heap,child);
    piVar4 = vec<int>::operator[](&this->indices,*piVar4);
    *piVar4 = child;
    child = local_4c;
  }
  piVar4 = vec<int>::operator[](&this->heap,child);
  *piVar4 = y;
  piVar4 = vec<int>::operator[](&this->indices,y);
  *piVar4 = child;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }